

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::HilbertTransform
          (EpochTracker *this,int16_t *input,int32_t n_input,float *output)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  float *x;
  FFT *y;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int i_4;
  float tmp_1;
  int i_3;
  float tmp;
  int i_2;
  int i_1;
  int i;
  float *im;
  float *re;
  int32_t n_fft;
  FFT ft;
  undefined8 in_stack_ffffffffffffff48;
  FFT *in_stack_ffffffffffffff50;
  FFT *this_00;
  int local_84;
  int local_7c;
  int local_74;
  int local_70;
  int local_6c;
  FFT local_40;
  long local_20;
  int local_14;
  long local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  FFT::fft_pow2_from_window_size(in_EDX);
  FFT::FFT(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  iVar4 = FFT::get_fftSize(&local_40);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  x = (float *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  y = (FFT *)operator_new__(uVar5);
  for (local_6c = 0; local_6c < local_14; local_6c = local_6c + 1) {
    x[local_6c] = (float)(int)*(short *)(local_10 + (long)local_6c * 2);
    *(float *)((long)&y->fsine + (long)local_6c * 4) = 0.0;
  }
  for (local_70 = local_14; local_70 < iVar4; local_70 = local_70 + 1) {
    x[local_70] = 0.0;
    *(float *)((long)&y->fsine + (long)local_70 * 4) = 0.0;
  }
  this_00 = y;
  FFT::fft(&local_40,x,(float *)y);
  for (local_74 = 1; local_74 < iVar4 / 2; local_74 = local_74 + 1) {
    fVar1 = *(float *)((long)&y->fsine + (long)local_74 * 4);
    *(float *)((long)&y->fsine + (long)local_74 * 4) = -x[local_74];
    x[local_74] = fVar1;
  }
  *(float *)&y->fsine = 0.0;
  *x = 0.0;
  local_7c = iVar4 / 2;
  while (local_7c = local_7c + 1, local_7c < iVar4) {
    fVar1 = *(float *)((long)&y->fsine + (long)local_7c * 4);
    *(float *)((long)&y->fsine + (long)local_7c * 4) = x[local_7c];
    x[local_7c] = -fVar1;
  }
  FFT::ifft(&local_40,x,(float *)y);
  for (local_84 = 0; local_84 < local_14; local_84 = local_84 + 1) {
    *(float *)(local_20 + (long)local_84 * 4) = x[local_84] / (float)iVar4;
  }
  if (x != (float *)0x0) {
    operator_delete__(x);
  }
  if (y != (FFT *)0x0) {
    operator_delete__(y);
  }
  FFT::~FFT(this_00);
  return;
}

Assistant:

void EpochTracker::HilbertTransform(int16_t* input, int32_t n_input,
                                    float* output) {
  FFT ft = FFT(FFT::fft_pow2_from_window_size(n_input));
  int32_t n_fft = ft.get_fftSize();
  float* re = new float[n_fft];
  float* im = new float[n_fft];
  for (int i = 0; i < n_input; ++i) {
    re[i] = input[i];
    im[i] = 0.0;
  }
  for (int i = n_input; i < n_fft; ++i) {
    re[i] = 0.0;
    im[i] = 0.0;
  }
  ft.fft(re, im);
  for (int i = 1; i < n_fft/2; ++i) {
    float tmp = im[i];
    im[i] = -re[i];
    re[i] = tmp;
  }
  re[0] = im[0] = 0.0;
  for (int i = n_fft/2 + 1; i < n_fft; ++i) {
    float tmp = im[i];
    im[i] = re[i];
    re[i] = -tmp;
  }
  ft.ifft(re, im);
  for (int i = 0; i < n_input; ++i) {
    output[i] = re[i] / n_fft;
  }
  delete [] re;
  delete [] im;
}